

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void packforblock11(uint32_t base,uint32_t **pin,uint8_t **pw)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  ulong *puVar32;
  uint32_t *puVar33;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint32_t *in;
  uint64_t *pw64;
  uint8_t **pw_local;
  uint32_t **pin_local;
  uint32_t base_local;
  
  puVar32 = (ulong *)*pw;
  puVar33 = *pin;
  uVar1 = puVar33[5];
  uVar2 = puVar33[6];
  uVar3 = puVar33[7];
  uVar4 = puVar33[8];
  uVar5 = puVar33[9];
  uVar6 = puVar33[10];
  uVar7 = puVar33[0xb];
  uVar8 = puVar33[0xb];
  uVar9 = puVar33[0xc];
  uVar10 = puVar33[0xd];
  uVar11 = puVar33[0xe];
  uVar12 = puVar33[0xf];
  uVar13 = puVar33[0x10];
  uVar14 = puVar33[0x11];
  uVar15 = puVar33[0x11];
  uVar16 = puVar33[0x12];
  uVar17 = puVar33[0x13];
  uVar18 = puVar33[0x14];
  uVar19 = puVar33[0x15];
  uVar20 = puVar33[0x16];
  uVar21 = puVar33[0x17];
  uVar22 = puVar33[0x17];
  uVar23 = puVar33[0x18];
  uVar24 = puVar33[0x19];
  uVar25 = puVar33[0x1a];
  uVar26 = puVar33[0x1b];
  uVar27 = puVar33[0x1c];
  uVar28 = puVar33[0x1d];
  uVar29 = puVar33[0x1d];
  uVar30 = puVar33[0x1e];
  uVar31 = puVar33[0x1f];
  *puVar32 = (ulong)(puVar33[5] - base) << 0x37 |
             (ulong)(puVar33[4] - base) << 0x2c |
             (ulong)(puVar33[3] - base) << 0x21 |
             (ulong)(puVar33[2] - base) << 0x16 |
             (ulong)(puVar33[1] - base) << 0xb | (ulong)(*puVar33 - base);
  puVar32[1] = (ulong)(uVar7 - base) << 0x39 |
               (ulong)(uVar6 - base) << 0x2e |
               (ulong)(uVar5 - base) << 0x23 |
               (ulong)(uVar4 - base) << 0x18 |
               (ulong)(uVar3 - base) << 0xd |
               (ulong)(uVar2 - base) << 2 | (ulong)(uVar1 - base >> 9);
  puVar32[2] = (ulong)(uVar14 - base) << 0x3b |
               (ulong)(uVar13 - base) << 0x30 |
               (ulong)(uVar12 - base) << 0x25 |
               (ulong)(uVar11 - base) << 0x1a |
               (ulong)(uVar10 - base) << 0xf |
               (ulong)(uVar9 - base) << 4 | (ulong)(uVar8 - base >> 7);
  puVar32[3] = (ulong)(uVar21 - base) << 0x3d |
               (ulong)(uVar20 - base) << 0x32 |
               (ulong)(uVar19 - base) << 0x27 |
               (ulong)(uVar18 - base) << 0x1c |
               (ulong)(uVar17 - base) << 0x11 |
               (ulong)(uVar16 - base) << 6 | (ulong)(uVar15 - base >> 5);
  puVar32[4] = (ulong)(uVar28 - base) << 0x3f |
               (ulong)(uVar27 - base) << 0x34 |
               (ulong)(uVar26 - base) << 0x29 |
               (ulong)(uVar25 - base) << 0x1e |
               (ulong)(uVar24 - base) << 0x13 |
               (ulong)(uVar23 - base) << 8 | (ulong)(uVar22 - base >> 3);
  puVar32[5] = (ulong)(uVar31 - base) << 0x15 |
               (ulong)(uVar30 - base) << 10 | (ulong)(uVar29 - base >> 1);
  *pin = *pin + 0x20;
  *pw = *pw + 0x2c;
  return;
}

Assistant:

static void packforblock11(const uint32_t base, const uint32_t **pin,
                           uint8_t **pw) {
  uint64_t *pw64 = *(uint64_t **)pw;
  const uint32_t *in = *pin;
  /* we are going to touch  6 64-bit words */
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  w0 = (uint64_t)(in[0] - base);
  w0 |= (uint64_t)(in[1] - base) << 11;
  w0 |= (uint64_t)(in[2] - base) << 22;
  w0 |= (uint64_t)(in[3] - base) << 33;
  w0 |= (uint64_t)(in[4] - base) << 44;
  w0 |= (uint64_t)(in[5] - base) << 55;
  w1 = (uint64_t)(in[5] - base) >> 9;
  w1 |= (uint64_t)(in[6] - base) << 2;
  w1 |= (uint64_t)(in[7] - base) << 13;
  w1 |= (uint64_t)(in[8] - base) << 24;
  w1 |= (uint64_t)(in[9] - base) << 35;
  w1 |= (uint64_t)(in[10] - base) << 46;
  w1 |= (uint64_t)(in[11] - base) << 57;
  w2 = (uint64_t)(in[11] - base) >> 7;
  w2 |= (uint64_t)(in[12] - base) << 4;
  w2 |= (uint64_t)(in[13] - base) << 15;
  w2 |= (uint64_t)(in[14] - base) << 26;
  w2 |= (uint64_t)(in[15] - base) << 37;
  w2 |= (uint64_t)(in[16] - base) << 48;
  w2 |= (uint64_t)(in[17] - base) << 59;
  w3 = (uint64_t)(in[17] - base) >> 5;
  w3 |= (uint64_t)(in[18] - base) << 6;
  w3 |= (uint64_t)(in[19] - base) << 17;
  w3 |= (uint64_t)(in[20] - base) << 28;
  w3 |= (uint64_t)(in[21] - base) << 39;
  w3 |= (uint64_t)(in[22] - base) << 50;
  w3 |= (uint64_t)(in[23] - base) << 61;
  w4 = (uint64_t)(in[23] - base) >> 3;
  w4 |= (uint64_t)(in[24] - base) << 8;
  w4 |= (uint64_t)(in[25] - base) << 19;
  w4 |= (uint64_t)(in[26] - base) << 30;
  w4 |= (uint64_t)(in[27] - base) << 41;
  w4 |= (uint64_t)(in[28] - base) << 52;
  w4 |= (uint64_t)(in[29] - base) << 63;
  w5 = (uint64_t)(in[29] - base) >> 1;
  w5 |= (uint64_t)(in[30] - base) << 10;
  w5 |= (uint64_t)(in[31] - base) << 21;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  *pin += 32; /* we consumed 32 32-bit integers */
  *pw += 44;  /* we used up 44 output bytes */
}